

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool art_iterator_lower_bound(art_iterator_t *iterator,art_key_chunk_t *key)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  size_t __n;
  art_ref_t ref;
  
  if (iterator->value == (art_val_t *)0x0) {
    iterator->depth = '\0';
    iterator->frame = '\0';
    ref = iterator->frames[0].ref;
    if (ref == 0) {
      return false;
    }
  }
  else {
    __n = 6;
    while (iVar2 = memcmp(iterator,key,__n), iVar2 != 0) {
      _Var1 = art_iterator_up(iterator);
      if (!_Var1) {
        if (iVar2 < 0) {
          iterator->key[4] = '\0';
          iterator->key[5] = '\0';
          iterator->key[0] = '\0';
          iterator->key[1] = '\0';
          iterator->key[2] = '\0';
          iterator->key[3] = '\0';
          iterator->value = (art_val_t *)0x0;
          return false;
        }
        art_node_init_iterator(iterator->frames[iterator->frame].ref,iterator,true);
        return true;
      }
      pcVar3 = (char *)art_iterator_node(iterator);
      __n = (size_t)(byte)(*pcVar3 + iterator->depth);
    }
    ref = iterator->frames[iterator->frame].ref;
  }
  _Var1 = art_node_iterator_lower_bound(ref,iterator,key);
  return _Var1;
}

Assistant:

bool art_iterator_lower_bound(art_iterator_t *iterator,
                              const art_key_chunk_t *key) {
    if (iterator->value == NULL) {
        // We're beyond the end / start of the ART so the iterator does not
        // have a valid key. Start from the root.
        iterator->frame = 0;
        iterator->depth = 0;
        art_ref_t root = art_iterator_ref(iterator);
        if (root == CROARING_ART_NULL_REF) {
            return false;
        }
        return art_node_iterator_lower_bound(root, iterator, key);
    }
    int compare_result =
        art_compare_prefix(iterator->key, 0, key, 0, ART_KEY_BYTES);
    // Move up until we have an equal prefix, after which we can do a normal
    // lower bound search.
    while (compare_result != 0) {
        if (!art_iterator_up(iterator)) {
            if (compare_result < 0) {
                // Only smaller keys found.
                return art_iterator_invalid_loc(iterator);
            } else {
                return art_node_init_iterator(art_iterator_ref(iterator),
                                              iterator, true);
            }
        }
        // Since we're only moving up, we can keep comparing against the
        // iterator key.
        art_inner_node_t *inner_node =
            (art_inner_node_t *)art_iterator_node(iterator);
        compare_result =
            art_compare_prefix(iterator->key, 0, key, 0,
                               iterator->depth + inner_node->prefix_size);
    }
    if (compare_result > 0) {
        return art_node_init_iterator(art_iterator_ref(iterator), iterator,
                                      true);
    }
    return art_node_iterator_lower_bound(art_iterator_ref(iterator), iterator,
                                         key);
}